

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::BaseRAPass::_dumpLiveSpans(BaseRAPass *this,String *sb)

{
  uint uVar1;
  RAWorkReg *pRVar2;
  long lVar3;
  RAWorkReg **ppRVar4;
  RALiveSpan<asmjit::v1_14::LiveRegData> *pRVar5;
  String *in_RSI;
  String *in_RDI;
  LiveRegSpan *liveSpan;
  uint32_t x;
  LiveRegSpans *liveSpans;
  RALiveStats *stats;
  size_t oldSize;
  RAWorkReg *workReg;
  uint32_t workId;
  uint32_t maxSize;
  uint32_t numWorkRegs;
  size_t in_stack_fffffffffffffe30;
  String *in_stack_fffffffffffffe38;
  uint *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  String *in_stack_fffffffffffffe50;
  ModifyOp op;
  uint local_194;
  uint local_15c;
  
  uVar1 = *(uint *)(in_RDI + 0x148);
  for (local_15c = 0; op = (ModifyOp)((ulong)in_stack_fffffffffffffe50 >> 0x20), local_15c < uVar1;
      local_15c = local_15c + 1) {
    ppRVar4 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                        ((ZoneVector<asmjit::v1_14::RAWorkReg_*> *)in_stack_fffffffffffffe38,
                         in_stack_fffffffffffffe30);
    pRVar2 = *ppRVar4;
    String::_opString(in_RDI,op,in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40);
    if ((byte)*in_RSI < 0x1f) {
      in_stack_fffffffffffffe48 = (char *)(ulong)(byte)*in_RSI;
    }
    else {
      in_stack_fffffffffffffe48 = *(char **)(in_RSI + 8);
    }
    lVar3 = *(long *)(pRVar2 + 8);
    in_stack_fffffffffffffe40 = (uint *)(lVar3 + 0x18);
    if (*in_stack_fffffffffffffe40 < 0xc) {
      in_stack_fffffffffffffe30 = lVar3 + 0x1c;
    }
    else {
      in_stack_fffffffffffffe30 = *(size_t *)(lVar3 + 0x20);
    }
    in_stack_fffffffffffffe38 = in_RSI;
    in_stack_fffffffffffffe50 = in_RSI;
    String::_opString(in_RDI,(ModifyOp)((ulong)in_RSI >> 0x20),in_stack_fffffffffffffe48,
                      (size_t)in_stack_fffffffffffffe40);
    String::padEnd(in_RDI,(size_t)in_stack_fffffffffffffe50,
                   (char)((ulong)in_stack_fffffffffffffe48 >> 0x38));
    String::_opFormat((String *)(double)*(float *)(pRVar2 + 100),
                      (ModifyOp)(double)*(float *)(pRVar2 + 0x68),(char *)in_RSI,1,
                      " {id:%04u width: %-4u freq: %0.4f priority=%0.4f}",
                      (ulong)*(uint *)(pRVar2 + 4),(ulong)*(uint *)(pRVar2 + 0x60));
    String::_opString(in_RDI,(ModifyOp)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                      in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40);
    local_194 = 0;
    while( true ) {
      if (*(uint *)(pRVar2 + 0x58) <= local_194) break;
      pRVar5 = ZoneVector<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_>::operator[]
                         ((ZoneVector<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>_> *)
                          in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      if (local_194 != 0) {
        String::_opString(in_RDI,(ModifyOp)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                          in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40);
      }
      String::_opFormat(in_RSI,kAppend,"[%u:%u]",(ulong)*(uint *)pRVar5,(ulong)*(uint *)(pRVar5 + 4)
                       );
      local_194 = local_194 + 1;
    }
    String::_opChar(in_stack_fffffffffffffe38,(ModifyOp)(in_stack_fffffffffffffe30 >> 0x20),
                    (char)(in_stack_fffffffffffffe30 >> 0x18));
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error BaseRAPass::_dumpLiveSpans(String& sb) noexcept {
  uint32_t numWorkRegs = _workRegs.size();
  uint32_t maxSize = _maxWorkRegNameSize;

  for (uint32_t workId = 0; workId < numWorkRegs; workId++) {
    RAWorkReg* workReg = _workRegs[workId];

    sb.append("  ");

    size_t oldSize = sb.size();
    sb.append(workReg->name());
    sb.padEnd(oldSize + maxSize);

    RALiveStats& stats = workReg->liveStats();
    sb.appendFormat(" {id:%04u width: %-4u freq: %0.4f priority=%0.4f}",
      workReg->virtId(),
      stats.width(),
      stats.freq(),
      stats.priority());
    sb.append(": ");

    LiveRegSpans& liveSpans = workReg->liveSpans();
    for (uint32_t x = 0; x < liveSpans.size(); x++) {
      const LiveRegSpan& liveSpan = liveSpans[x];
      if (x)
        sb.append(", ");
      sb.appendFormat("[%u:%u]", liveSpan.a, liveSpan.b);
    }

    sb.append('\n');
  }

  return kErrorOk;
}